

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getticks.c
# Opt level: O3

unsigned_long getticks(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  timespec ts;
  timespec local_18;
  
  iVar1 = clock_gettime(1,&local_18);
  if (iVar1 == 0) {
    lVar3 = SUB168(SEXT816(0x431bde82d7b634db) * SEXT816(local_18.tv_nsec),8);
    lVar2 = local_18.tv_nsec / 1000000 + (local_18.tv_nsec >> 0x3f);
  }
  else {
    gettimeofday((timeval *)&local_18,(__timezone_ptr_t)0x0);
    lVar3 = SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_18.tv_nsec),8);
    lVar2 = local_18.tv_nsec / 1000 + (local_18.tv_nsec >> 0x3f);
  }
  return (lVar2 - (lVar3 >> 0x3f)) + local_18.tv_sec * 1000;
}

Assistant:

unsigned long getticks(void)
{
    /*
     * We want to use milliseconds rather than the microseconds or
     * nanoseconds given by the underlying clock functions, because we
     * need a decent number of them to fit into a 32-bit word so it
     * can be used for keepalives.
     */
#if HAVE_CLOCK_GETTIME && HAVE_CLOCK_MONOTONIC
    {
        /* Use CLOCK_MONOTONIC if available, so as to be unconfused if
         * the system clock changes. */
        struct timespec ts;
        if (clock_gettime(CLOCK_MONOTONIC, &ts) == 0)
            return ts.tv_sec * TICKSPERSEC +
                ts.tv_nsec / (1000000000 / TICKSPERSEC);
    }
#endif
    {
        struct timeval tv;
        gettimeofday(&tv, NULL);
        return tv.tv_sec * TICKSPERSEC + tv.tv_usec / (1000000 / TICKSPERSEC);
    }
}